

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_defun.hpp
# Opt level: O1

SQInteger squall::detail::stub<2,std::function<void(std::shared_ptr<Foo>)>>(HSQUIRRELVM vm)

{
  int iVar1;
  SQRESULT SVar2;
  SQUserPointer fp;
  undefined8 *local_a8 [4];
  _Any_data local_88;
  _Manager_type local_78;
  
  SVar2 = sq_getuserdata(vm,-1,local_a8,(SQUserPointer *)0x0);
  if (-1 < SVar2) {
    std::function<void_(std::shared_ptr<Foo>)>::function
              ((function<void_(std::shared_ptr<Foo>)> *)&local_88,
               (function<void_(std::shared_ptr<Foo>)> *)*local_a8[0]);
    iVar1 = Stub<void(std::shared_ptr<Foo>)>::doit<std::function<void(std::shared_ptr<Foo>)>>
                      (vm,2,(function<void_(std::shared_ptr<Foo>)> *)&local_88);
    if (local_78 != (code *)0x0) {
      (*local_78)(&local_88,&local_88,__destroy_functor);
    }
    return (long)iVar1;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/KatuH[P]squall/samples/../squall/squall_defun.hpp"
                ,0x42,
                "SQInteger squall::detail::stub(HSQUIRRELVM) [Offset = 2, F = std::function<void (std::shared_ptr<Foo>)>]"
               );
}

Assistant:

SQInteger stub(HSQUIRRELVM vm) {
    try {
        SQUserPointer fp;
        if(!SQ_SUCCEEDED(sq_getuserdata(vm, -1, &fp, NULL))) { assert(0); }
        const F& f = **((F**)fp);

        SQInteger x = Stub<typename detail::function_traits<F>::type>::doit(
            vm, Offset, f);
        return x;
    }
    catch(std::exception& e) {
        return sq_throwerror(
            vm, (string(_SC("error in callback: ")) + locale_converter::to_squall_string(e.what()).c_str()).c_str());
    }
}